

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlayerStrategy.cpp
# Opt level: O1

int __thiscall CheaterBotStrategy::cheaterReinforce(CheaterBotStrategy *this)

{
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *pvVar1;
  pointer ppCVar2;
  Country *pCVar3;
  pointer pcVar4;
  int *piVar5;
  Player *pPVar6;
  CheaterBotStrategy *pCVar7;
  ostream *poVar8;
  PlayerState *pPVar9;
  pointer ppCVar10;
  long *local_58;
  long local_50;
  long local_48 [2];
  CheaterBotStrategy *local_38;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "We have a cheater! They are doubling all armies on their countries",0x42);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
  std::ostream::put(-0x80);
  std::ostream::flush();
  pvVar1 = ((this->super_PlayerStrategy).player)->pOwnedCountries;
  ppCVar10 = (pvVar1->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
             super__Vector_impl_data._M_start;
  ppCVar2 = (pvVar1->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  local_38 = this;
  if (ppCVar10 != ppCVar2) {
    do {
      pCVar3 = *ppCVar10;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"[CHEATER] - Country ",0x14);
      pcVar4 = (pCVar3->cyName->_M_dataplus)._M_p;
      local_58 = local_48;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_58,pcVar4,pcVar4 + pCVar3->cyName->_M_string_length);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(char *)local_58,local_50);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8," had ",5);
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,*pCVar3->pNumberOfTroops);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8," armies. It now has ",0x14);
      if (local_58 != local_48) {
        operator_delete(local_58,local_48[0] + 1);
      }
      piVar5 = pCVar3->pNumberOfTroops;
      if (0 < *piVar5) {
        *piVar5 = *piVar5 * 2;
      }
      poVar8 = (ostream *)std::ostream::operator<<(&std::cout,*piVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8," armies. -",10);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
      std::ostream::put((char)poVar8);
      std::ostream::flush();
      ppCVar10 = ppCVar10 + 1;
    } while (ppCVar10 != ppCVar2);
  }
  pCVar7 = local_38;
  pPVar6 = (local_38->super_PlayerStrategy).player;
  pPVar9 = pPVar6->currentState;
  if (pPVar9 != (PlayerState *)0x0) {
    operator_delete(pPVar9,4);
  }
  pPVar9 = (PlayerState *)operator_new(4);
  *pPVar9 = IDLE;
  pPVar6->currentState = pPVar9;
  (*((pCVar7->super_PlayerStrategy).player)->strategy->_vptr_PlayerStrategy[5])();
  return 1;
}

Assistant:

int CheaterBotStrategy::cheaterReinforce() {
    std::cout << "We have a cheater! They are doubling all armies on their countries" << std::endl;

    for(auto* country : *this->player->getOwnedCountries()) {
        std::cout << "[CHEATER] - Country " << country->getCountryName() << " had " << country->getNumberOfTroops() << " armies. It now has ";
        //prevent overflow
        if(country->getNumberOfTroops() * 2 > 0 && country->getNumberOfTroops() * 2 < 2147483647){
            country->setNumberOfTroops(country->getNumberOfTroops() * 2);
        }
        std::cout << country->getNumberOfTroops() << " armies. -" << std::endl;
    }

    player->setPlayerState(PlayerState::IDLE);
    player->getStrategy()->resetChoices();
    return PlayerAction::SUCCEEDED;
}